

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheatSheetTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_CheatSheet_TestName_TestShell::createTest(TEST_CheatSheet_TestName_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CheatSheetTest.cpp"
                                  ,0x19);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0033feb8;
  return this_00;
}

Assistant:

TEST(CheatSheet, TestName)
{
    /* Check two longs are equal */
    LONGS_EQUAL(1, 1);

    /* Check a condition */
    CHECK(true == true);

    /* Check a string */
    STRCMP_EQUAL("HelloWorld", "HelloWorld");
}